

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

String * __thiscall
nigel::Token_Identifier::toString_abi_cxx11_
          (String *__return_storage_ptr__,Token_Identifier *this,bool extended)

{
  char *__rhs;
  undefined7 in_register_00000011;
  
  __rhs = "";
  if ((int)CONCAT71(in_register_00000011,extended) != 0) {
    __rhs = "\t\tas identifier";
  }
  std::operator+(__return_storage_ptr__,&this->identifier,__rhs);
  return __return_storage_ptr__;
}

Assistant:

String Token_Identifier::toString( bool extended ) const
	{
		return identifier + ( extended ? "\t\tas identifier" : "" );
	}